

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# libypspur-md.c
# Opt level: O0

int YPSpur_md_circle(YPSpur *spur,int cs,double x,double y,double r)

{
  int iVar1;
  undefined1 local_70 [8];
  YPSpur_msg msg;
  double r_local;
  double y_local;
  double x_local;
  int cs_local;
  YPSpur *spur_local;
  
  local_70 = (undefined1  [8])0x1;
  msg.msg_type = (long)spur->pid;
  msg.pid._0_4_ = 0x22;
  msg.pid._4_4_ = cs;
  msg._16_8_ = x;
  msg.data[0] = y;
  msg.data[1] = r;
  msg.data[3] = r;
  iVar1 = (*(spur->dev).send)(&spur->dev,(YPSpur_msg *)local_70);
  if (iVar1 < 0) {
    spur->connection_error = 1;
    spur_local._4_4_ = -1;
  }
  else {
    spur_local._4_4_ = 1;
  }
  return spur_local._4_4_;
}

Assistant:

int YPSpur_md_circle(YPSpur* spur, int cs, double x, double y, double r)
{
  YPSpur_msg msg;

  msg.msg_type = YPSPUR_MSG_CMD;
  msg.pid = spur->pid;
  msg.type = YPSPUR_CIRCLE;
  msg.data[0] = x;
  msg.data[1] = y;
  msg.data[2] = r;
  msg.cs = cs;
  if (spur->dev.send(&spur->dev, &msg) < 0)
  {
    /* error */
    spur->connection_error = 1;
    return -1;
  }

  return 1;
}